

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O1

void __thiscall ADynamicLight::Serialize(ADynamicLight *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  AActor::Serialize(&this->super_AActor,arc);
  pFVar1 = FArchive::operator<<(arc,&this->lightflags);
  FArchive::operator<<(pFVar1,&this->lighttype);
  pFVar1 = FArchive::operator<<(arc,(DWORD *)&this->m_tickCount);
  FArchive::operator<<(pFVar1,&this->m_currentRadius);
  pFVar1 = FArchive::operator<<(arc,(DWORD *)this->m_Radius);
  FArchive::operator<<(pFVar1,(DWORD *)(this->m_Radius + 1));
  if (this->lighttype == '\x01') {
    pFVar1 = FArchive::operator<<(arc,&this->m_lastUpdate);
    FCycler::Serialize(&this->m_cycler,pFVar1);
  }
  if (arc->m_Loading == true) {
    this->visibletoplayer = true;
    LinkLight(this);
    return;
  }
  return;
}

Assistant:

void ADynamicLight::Serialize(FArchive &arc)
{
	Super::Serialize (arc);
	arc << lightflags << lighttype;
	arc << m_tickCount << m_currentRadius;
	arc << m_Radius[0] << m_Radius[1];

	if (lighttype == PulseLight) arc << m_lastUpdate << m_cycler;
	if (arc.IsLoading())
	{
		// The default constructor which is used for creating objects before deserialization will not set this variable.
		// It needs to be true for all placed lights.
		visibletoplayer = true;
		LinkLight();
	}
}